

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

bool __thiscall
PageStack<FinalizableObject_*>::Push(PageStack<FinalizableObject_*> *this,FinalizableObject *item)

{
  FinalizableObject **ppFVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *pCVar4;
  undefined4 *puVar5;
  Chunk *pCVar6;
  size_t sVar7;
  Chunk *pCVar8;
  
  pCVar6 = (Chunk *)this->nextEntry;
  pCVar4 = (Chunk *)this->chunkEnd;
  if (pCVar6 == pCVar4) {
    pCVar4 = CreateChunk(this);
    if (pCVar4 == (Chunk *)0x0) {
      return false;
    }
    pCVar4->nextChunk = this->currentChunk;
    this->currentChunk = pCVar4;
    pCVar6 = pCVar4 + 1;
    this->chunkStart = (FinalizableObject **)pCVar6;
    pCVar4 = pCVar4 + 0x80;
    this->chunkEnd = (FinalizableObject **)pCVar4;
    this->nextEntry = (FinalizableObject **)pCVar6;
    pCVar8 = pCVar6;
  }
  else {
    pCVar8 = (Chunk *)this->chunkStart;
  }
  if (pCVar6 < pCVar8 || pCVar4 <= pCVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x84,"(nextEntry >= chunkStart && nextEntry < chunkEnd)",
                       "nextEntry >= chunkStart && nextEntry < chunkEnd");
    if (!bVar3) goto LAB_006626fb;
    *puVar5 = 0;
    pCVar6 = (Chunk *)this->nextEntry;
  }
  (pCVar6->super_PagePoolPage).pageAllocator = (PageAllocator *)item;
  ppFVar1 = this->nextEntry;
  this->nextEntry = ppFVar1 + 1;
  sVar7 = this->count + 1;
  this->count = sVar7;
  if (sVar7 != (((long)(ppFVar1 + 1) - (long)this->chunkStart >> 3) + this->pageCount * 0x1fc) -
               0x1fc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x8b,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar3) {
LAB_006626fb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Push(T item)
{
    if (nextEntry == chunkEnd)
    {
        Chunk * newChunk = CreateChunk();
        if (newChunk == nullptr)
        {
            return false;
        }

        newChunk->nextChunk = currentChunk;
        currentChunk = newChunk;

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkStart;
    }

    Assert(nextEntry >= chunkStart && nextEntry < chunkEnd);

    *nextEntry = item;
    nextEntry++;

#if DBG
    count++;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}